

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O2

void ggml_backend_sched_split_graph(ggml_backend_sched_t sched,ggml_cgraph *graph)

{
  ggml_hash_set *hash_set;
  int iVar1;
  uint uVar2;
  ggml_tensor *pgVar3;
  int *piVar4;
  ggml_backend_dev_t pgVar5;
  ggml_tensor *pgVar6;
  int *piVar7;
  ggml_backend_sched_split *pgVar8;
  ggml_init_params params;
  _Bool _Var9;
  int iVar10;
  ggml_context *pgVar11;
  size_t sVar12;
  size_t sVar13;
  int *piVar14;
  ggml_backend_sched_split *pgVar15;
  ggml_tensor *pgVar16;
  ggml_backend_t pgVar17;
  ggml_tensor **ppgVar18;
  int c_2;
  ulong uVar19;
  char *pcVar20;
  char *pcVar21;
  int n_supported;
  int iVar22;
  ggml_cgraph *pgVar23;
  long lVar24;
  ggml_cgraph *pgVar25;
  int i;
  long lVar26;
  long lVar27;
  int b_1;
  int j_4;
  int b;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  byte bVar31;
  int local_bc;
  ggml_backend_sched_split *local_b8;
  undefined7 uStack_87;
  ggml_cgraph local_80;
  
  bVar31 = 0;
  sched->n_splits = 0;
  sched->n_graph_inputs = 0;
  sched->is_reset = false;
  sVar12 = sched->context_buffer_size;
  pcVar20 = sched->context_buffer;
  ggml_free(sched->ctx);
  params._17_7_ = uStack_87;
  params.no_alloc = true;
  params.mem_buffer = pcVar20;
  params.mem_size = sVar12;
  pgVar11 = ggml_init(params);
  sched->ctx = pgVar11;
  if (pgVar11 == (ggml_context *)0x0) {
    pcVar21 = "%s: failed to initialize context\n";
    pcVar20 = "ggml_backend_sched_split_graph";
    iVar10 = 0x36f;
LAB_0012c5a2:
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-backend.cpp"
               ,iVar10,pcVar21,pcVar20);
  }
  hash_set = &sched->hash_set;
  for (lVar26 = 0; lVar26 < graph->n_leafs; lVar26 = lVar26 + 1) {
    pgVar3 = graph->leafs[lVar26];
    piVar4 = sched->hv_tensor_backend_ids;
    sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
    if (piVar4[sVar12] == -1) {
      iVar10 = ggml_backend_sched_backend_id_from_cur(sched,pgVar3);
      piVar4[sVar12] = iVar10;
    }
  }
  for (lVar26 = 0; uVar19 = (ulong)graph->n_nodes, lVar26 < (long)uVar19; lVar26 = lVar26 + 1) {
    pgVar3 = graph->nodes[lVar26];
    piVar4 = sched->hv_tensor_backend_ids;
    sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
    if (piVar4[sVar12] == -1) {
      iVar10 = ggml_backend_sched_backend_id_from_cur(sched,pgVar3);
      piVar4[sVar12] = iVar10;
    }
  }
  iVar10 = -1;
  for (lVar26 = 0; lVar26 < (int)uVar19; lVar26 = lVar26 + 1) {
    pgVar3 = graph->nodes[lVar26];
    iVar22 = iVar10;
    if (3 < pgVar3->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
      iVar22 = piVar4[sVar12];
      if (iVar22 == -1) {
        iVar22 = -1;
        if ((iVar10 != -1) &&
           (pgVar5 = sched->backends[iVar10]->device,
           _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3), iVar22 = iVar10, _Var9)) {
          piVar4[sVar12] = iVar10;
        }
      }
      else if (iVar22 == sched->n_backends + -1) {
        iVar22 = -1;
      }
    }
    uVar19 = (ulong)(uint)graph->n_nodes;
    iVar10 = iVar22;
  }
  uVar19 = uVar19 & 0xffffffff;
LAB_0012b51e:
  iVar10 = -1;
LAB_0012b521:
  uVar30 = uVar19 & 0xffffffff;
  while( true ) {
    uVar19 = uVar19 - 1;
    if ((int)uVar30 < 1) break;
    pgVar3 = graph->nodes[uVar19];
    if (3 < pgVar3->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
      iVar22 = piVar4[sVar12];
      if (iVar22 != -1) goto LAB_0012b59c;
      if (iVar10 == -1) goto LAB_0012b51e;
      pgVar5 = sched->backends[iVar10]->device;
      _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3);
      if (_Var9) {
        piVar4[sVar12] = iVar10;
      }
    }
    uVar30 = (ulong)((int)uVar30 - 1);
  }
  iVar10 = -1;
  for (lVar26 = 0; lVar26 < graph->n_nodes; lVar26 = lVar26 + 1) {
    pgVar3 = graph->nodes[lVar26];
    iVar22 = iVar10;
    if (3 < pgVar3->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
      iVar22 = piVar4[sVar12];
      if (((iVar22 == -1) && (iVar22 = -1, iVar10 != -1)) &&
         (pgVar5 = sched->backends[iVar10]->device,
         _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3), iVar22 = iVar10, _Var9)) {
        piVar4[sVar12] = iVar10;
      }
    }
    iVar10 = iVar22;
  }
  uVar19 = (ulong)(uint)graph->n_nodes;
  iVar10 = -1;
LAB_0012b630:
  iVar22 = iVar10;
  uVar30 = uVar19 & 0xffffffff;
  while( true ) {
    uVar19 = uVar19 - 1;
    if ((int)uVar30 < 1) break;
    pgVar3 = graph->nodes[uVar19];
    if (3 < pgVar3->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
      iVar10 = piVar4[sVar12];
      if ((iVar10 != -1) || (iVar22 == -1)) goto LAB_0012b630;
      pgVar5 = sched->backends[iVar22]->device;
      _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3);
      if (_Var9) {
        piVar4[sVar12] = iVar22;
      }
    }
    uVar30 = (ulong)((int)uVar30 - 1);
  }
  for (lVar26 = 0; uVar19 = (ulong)graph->n_nodes, lVar26 < (long)uVar19; lVar26 = lVar26 + 1) {
    pgVar3 = graph->nodes[lVar26];
    if (3 < pgVar3->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
      iVar10 = piVar4[sVar12];
      if (iVar10 == -1) {
        iVar10 = -1;
        for (lVar28 = 0; lVar28 < sched->n_backends; lVar28 = lVar28 + 1) {
          pgVar5 = sched->backends[lVar28]->device;
          _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3);
          if (_Var9) {
            iVar22 = 0;
            for (lVar27 = 0; lVar27 != 10; lVar27 = lVar27 + 1) {
              pgVar6 = pgVar3->src[lVar27];
              if ((pgVar6 != (ggml_tensor *)0x0) &&
                 ((piVar7 = sched->hv_tensor_backend_ids,
                  sVar13 = ggml_hash_find_or_insert(hash_set,pgVar6), piVar7[sVar13] != -1 ||
                  (piVar7 = sched->hv_tensor_backend_ids,
                  sVar13 = ggml_hash_find_or_insert(hash_set,pgVar6->view_src), piVar7[sVar13] != -1
                  )))) {
                _Var9 = ggml_backend_sched_buffer_supported(sched,pgVar6,(int)lVar28);
                iVar22 = iVar22 + (uint)_Var9;
              }
            }
            if (iVar10 < iVar22) {
              piVar4[sVar12] = (int)lVar28;
              iVar10 = iVar22;
            }
          }
        }
      }
      else {
        for (lVar28 = 0; lVar28 < iVar10; lVar28 = lVar28 + 1) {
          if ((sched->bufts[lVar28] == sched->bufts[iVar10]) &&
             (pgVar5 = sched->backends[lVar28]->device,
             _Var9 = (*(pgVar5->iface).supports_op)(pgVar5,pgVar3), _Var9)) {
            lVar27 = 0;
            while( true ) {
              if (lVar27 == 10) {
                piVar4[sVar12] = (int)lVar28;
                goto LAB_0012b791;
              }
              if ((pgVar3->src[lVar27] != (ggml_tensor *)0x0) &&
                 (_Var9 = ggml_backend_sched_buffer_supported(sched,pgVar3->src[lVar27],(int)lVar28)
                 , !_Var9)) break;
              lVar27 = lVar27 + 1;
            }
          }
          iVar10 = piVar4[sVar12];
        }
      }
    }
LAB_0012b791:
  }
  for (lVar26 = 0; lVar26 < (int)uVar19; lVar26 = lVar26 + 1) {
    pgVar3 = graph->nodes[lVar26];
    piVar4 = sched->hv_tensor_backend_ids;
    sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
    piVar4 = piVar4 + sVar12;
    if ((pgVar3->view_src != (ggml_tensor *)0x0) && (*piVar4 == -1)) {
      piVar7 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3->view_src);
      *piVar4 = piVar7[sVar12];
    }
    for (lVar28 = 0; lVar28 != 10; lVar28 = lVar28 + 1) {
      pgVar6 = pgVar3->src[lVar28];
      if (pgVar6 != (ggml_tensor *)0x0) {
        piVar7 = sched->hv_tensor_backend_ids;
        sVar12 = ggml_hash_find_or_insert(hash_set,pgVar6);
        if (piVar7[sVar12] == -1) {
          piVar14 = piVar4;
          if (pgVar6->view_src != (ggml_tensor *)0x0) {
            piVar14 = sched->hv_tensor_backend_ids;
            sVar13 = ggml_hash_find_or_insert(hash_set,pgVar6->view_src);
            piVar14 = piVar14 + sVar13;
          }
          piVar7[sVar12] = *piVar14;
        }
      }
    }
    uVar19 = (ulong)(uint)graph->n_nodes;
  }
  local_b8 = sched->splits;
  uVar29 = 0;
  uVar30 = uVar19 & 0xffffffff;
  if ((int)uVar19 < 1) {
    uVar30 = uVar29;
  }
  do {
    if (uVar30 == uVar29) {
      iVar10 = local_b8->backend_id;
LAB_0012b996:
      local_b8->i_start = 0;
      local_b8->n_inputs = 0;
      local_bc = 0;
      do {
        uVar19 = (ulong)graph->n_nodes;
        if ((long)uVar19 <= (long)uVar30) {
          local_b8->i_end = graph->n_nodes;
          local_bc = local_bc + 1;
          sched->n_splits = local_bc;
          if (sched->debug != 0) {
            uVar30 = 0;
            for (uVar29 = 0; local_bc = sched->n_splits, (long)uVar29 < (long)(int)uVar19;
                uVar29 = uVar29 + 1) {
              iVar10 = (int)uVar30;
              if (iVar10 < local_bc) {
                pgVar15 = sched->splits;
                if (uVar29 == (uint)pgVar15[iVar10].i_start) {
                  pgVar17 = sched->backends[pgVar15[iVar10].backend_id];
                  pcVar20 = "NULL";
                  if (pgVar17 != (ggml_backend_t)0x0) {
                    pcVar20 = (*(pgVar17->iface).get_name)(pgVar17);
                    pgVar15 = sched->splits;
                  }
                  ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n## SPLIT #%d: %s # %d inputs",uVar30,
                                    pcVar20,(ulong)(uint)pgVar15[iVar10].n_inputs);
                  for (lVar26 = 0; pgVar15 = sched->splits, lVar26 < pgVar15[iVar10].n_inputs;
                      lVar26 = lVar26 + 1) {
                    if (lVar26 == 0) {
                      ggml_log_internal(GGML_LOG_LEVEL_DEBUG,": ");
                      pgVar15 = sched->splits;
                    }
                    pgVar3 = pgVar15[iVar10].inputs[lVar26];
                    sVar12 = ggml_nbytes(pgVar3);
                    fmt_size(sVar12);
                    ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"[%s (%5.5s)] ",pgVar3->name,
                                      fmt_size::buffer);
                  }
                  ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
                  uVar30 = (ulong)(iVar10 + 1);
                }
              }
              pgVar3 = graph->nodes[uVar29];
              if ((3 < pgVar3->op - GGML_OP_RESHAPE) && (1 < sched->debug)) {
                pgVar17 = ggml_backend_sched_get_tensor_backend(sched,pgVar3);
                pcVar20 = ggml_op_name(pgVar3->op);
                sVar12 = ggml_nbytes(pgVar3);
                fmt_size(sVar12);
                pcVar21 = "NULL";
                if (pgVar17 != (ggml_backend_t)0x0) {
                  pcVar21 = (*(pgVar17->iface).get_name)(pgVar17);
                }
                ggml_log_internal(GGML_LOG_LEVEL_DEBUG,
                                  "node #%3d (%10.10s): %20.20s (%5.5s) [%5.5s %8.8s]:",
                                  uVar29 & 0xffffffff,pcVar20,pgVar3->name,fmt_size::buffer,pcVar21,
                                  "");
                for (lVar26 = 0; lVar26 != 10; lVar26 = lVar26 + 1) {
                  pgVar6 = pgVar3->src[lVar26];
                  if (pgVar6 != (ggml_tensor *)0x0) {
                    pgVar17 = ggml_backend_sched_get_tensor_backend(sched,pgVar6);
                    sVar12 = ggml_nbytes(pgVar6);
                    fmt_size(sVar12);
                    pcVar20 = "NULL";
                    if (pgVar17 != (ggml_backend_t)0x0) {
                      pcVar20 = (*(pgVar17->iface).get_name)(pgVar17);
                    }
                    ggml_log_internal(GGML_LOG_LEVEL_DEBUG," %20.20s (%5.5s) [%5.5s %8.8s]",
                                      pgVar6->name,fmt_size::buffer,pcVar20,"");
                  }
                }
                ggml_log_internal(GGML_LOG_LEVEL_DEBUG,"\n");
              }
              uVar19 = (ulong)(uint)graph->n_nodes;
            }
          }
          piVar4 = sched->node_backend_ids;
          piVar7 = sched->leaf_backend_ids;
          sched->node_backend_ids = sched->prev_node_backend_ids;
          sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
          sched->prev_node_backend_ids = piVar4;
          sched->prev_leaf_backend_ids = piVar7;
          iVar10 = graph->n_leafs;
          if (graph->n_leafs < graph->n_nodes) {
            iVar10 = graph->n_nodes;
          }
          iVar10 = local_bc * sched->n_copies * 0x14 + iVar10;
          if (iVar10 <= (sched->graph).size) {
LAB_0012c1a6:
            (sched->graph).n_nodes = 0;
            (sched->graph).n_leafs = 0;
            lVar26 = 0x10;
            for (lVar28 = 0; lVar28 < sched->n_splits; lVar28 = lVar28 + 1) {
              pgVar8 = sched->splits;
              pgVar15 = pgVar8 + lVar28;
              ggml_graph_view(&local_80,graph,pgVar8[lVar28].i_start,pgVar8[lVar28].i_end);
              pgVar23 = &local_80;
              pgVar25 = &pgVar8[lVar28].graph;
              for (lVar27 = 10; lVar27 != 0; lVar27 = lVar27 + -1) {
                iVar10 = pgVar23->n_nodes;
                pgVar25->size = pgVar23->size;
                pgVar25->n_nodes = iVar10;
                pgVar23 = (ggml_cgraph *)((long)pgVar23 + (ulong)bVar31 * -0x10 + 8);
                pgVar25 = (ggml_cgraph *)((long)pgVar25 + (ulong)bVar31 * -0x10 + 8);
              }
              for (lVar27 = 0; lVar27 < pgVar15->n_inputs; lVar27 = lVar27 + 1) {
                pgVar3 = *(ggml_tensor **)((long)pgVar8->inputs + lVar27 * 8 + lVar26 + -0x10);
                sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
                pgVar6 = sched->hv_tensor_copies
                         [(long)sched->n_backends * (long)sched->n_copies * sVar12 +
                          (long)pgVar15->backend_id * (long)sched->n_copies + (long)sched->cur_copy]
                ;
                pgVar16 = ggml_view_tensor(sched->ctx,pgVar3);
                pgVar16->src[0] = pgVar3;
                sched->node_backend_ids[(sched->graph).n_nodes] =
                     sched->hv_tensor_backend_ids[sVar12];
                iVar10 = (sched->graph).n_nodes;
                (sched->graph).n_nodes = iVar10 + 1;
                (sched->graph).nodes[iVar10] = pgVar16;
                sched->node_backend_ids[(long)iVar10 + 1] = pgVar15->backend_id;
                iVar10 = (sched->graph).n_nodes;
                (sched->graph).n_nodes = iVar10 + 1;
                (sched->graph).nodes[iVar10] = pgVar6;
              }
              for (lVar27 = (long)pgVar15->i_start; lVar27 < pgVar15->i_end; lVar27 = lVar27 + 1) {
                piVar4 = sched->hv_tensor_backend_ids;
                sVar12 = ggml_hash_find_or_insert(hash_set,graph->nodes[lVar27]);
                sched->node_backend_ids[(sched->graph).n_nodes] = piVar4[sVar12];
                pgVar3 = graph->nodes[lVar27];
                iVar10 = (sched->graph).n_nodes;
                (sched->graph).n_nodes = iVar10 + 1;
                (sched->graph).nodes[iVar10] = pgVar3;
              }
              lVar26 = lVar26 + 0xb8;
            }
            if (1 < sched->n_copies) {
              for (lVar26 = 0; lVar26 < sched->n_graph_inputs; lVar26 = lVar26 + 1) {
                pgVar3 = sched->graph_inputs[lVar26];
                sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
                piVar4 = sched->hv_tensor_backend_ids;
                sVar13 = ggml_hash_find_or_insert(hash_set,pgVar3);
                iVar10 = piVar4[sVar13];
                lVar28 = 0;
                while( true ) {
                  iVar22 = sched->n_copies;
                  if (iVar22 <= lVar28) break;
                  pgVar3 = sched->hv_tensor_copies
                           [(long)iVar22 * sVar12 * (long)sched->n_backends +
                            iVar22 * iVar10 + lVar28];
                  sched->leaf_backend_ids[(sched->graph).n_leafs] = iVar10;
                  iVar22 = (sched->graph).n_leafs;
                  (sched->graph).n_leafs = iVar22 + 1;
                  (sched->graph).leafs[iVar22] = pgVar3;
                  lVar28 = lVar28 + 1;
                }
              }
              for (lVar26 = 0; lVar26 < sched->n_splits; lVar26 = lVar26 + 1) {
                pgVar15 = sched->splits;
                iVar10 = pgVar15[lVar26].backend_id;
                for (lVar28 = 0; lVar28 < pgVar15[lVar26].n_inputs; lVar28 = lVar28 + 1) {
                  sVar12 = ggml_hash_find_or_insert(hash_set,pgVar15[lVar26].inputs[lVar28]);
                  lVar27 = 0;
                  while( true ) {
                    iVar22 = sched->n_copies;
                    if (iVar22 <= lVar27) break;
                    pgVar3 = sched->hv_tensor_copies
                             [(long)iVar22 * sVar12 * (long)sched->n_backends +
                              iVar22 * iVar10 + lVar27];
                    sched->leaf_backend_ids[(sched->graph).n_leafs] = iVar10;
                    iVar22 = (sched->graph).n_leafs;
                    (sched->graph).n_leafs = iVar22 + 1;
                    (sched->graph).leafs[iVar22] = pgVar3;
                    lVar27 = lVar27 + 1;
                  }
                }
              }
            }
            for (lVar26 = 0; lVar26 < graph->n_leafs; lVar26 = lVar26 + 1) {
              pgVar3 = graph->leafs[lVar26];
              piVar4 = sched->hv_tensor_backend_ids;
              sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
              sched->leaf_backend_ids[(sched->graph).n_leafs] = piVar4[sVar12];
              iVar10 = (sched->graph).n_leafs;
              (sched->graph).n_leafs = iVar10 + 1;
              (sched->graph).leafs[iVar10] = pgVar3;
            }
            return;
          }
          (sched->graph).size = iVar10;
          ppgVar18 = (ggml_tensor **)realloc((sched->graph).nodes,(long)iVar10 << 3);
          (sched->graph).nodes = ppgVar18;
          ppgVar18 = (ggml_tensor **)realloc((sched->graph).leafs,(long)iVar10 << 3);
          (sched->graph).leafs = ppgVar18;
          if ((sched->graph).nodes == (ggml_tensor **)0x0) {
            pcVar21 = "GGML_ASSERT(%s) failed";
            pcVar20 = "sched->graph.nodes != NULL";
            iVar10 = 0x4da;
          }
          else {
            if (ppgVar18 != (ggml_tensor **)0x0) goto LAB_0012c1a6;
            pcVar21 = "GGML_ASSERT(%s) failed";
            pcVar20 = "sched->graph.leafs != NULL";
            iVar10 = 0x4db;
          }
          goto LAB_0012c5a2;
        }
        pgVar3 = graph->nodes[uVar30];
        if (3 < pgVar3->op - GGML_OP_RESHAPE) {
          piVar4 = sched->hv_tensor_backend_ids;
          sVar12 = ggml_hash_find_or_insert(hash_set,pgVar3);
          iVar22 = piVar4[sVar12];
          if (iVar22 != iVar10) goto LAB_0012badf;
          if (0 < local_b8->n_inputs) {
            for (lVar26 = 0; lVar26 != 10; lVar26 = lVar26 + 1) {
              pgVar6 = pgVar3->src[lVar26];
              if (pgVar6 != (ggml_tensor *)0x0) {
                if ((((pgVar6->buffer != (ggml_backend_buffer *)0x0) &&
                     (pgVar6->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS)) &&
                    (piVar4 = sched->hv_tensor_backend_ids,
                    sVar12 = ggml_hash_find_or_insert(hash_set,pgVar6), piVar4[sVar12] != iVar10))
                   && (_Var9 = ggml_backend_sched_buffer_supported(sched,pgVar6,iVar10), !_Var9)) {
LAB_0012badf:
                  local_b8->i_end = (int)uVar30;
                  local_bc = local_bc + 1;
                  iVar10 = sched->splits_capacity;
                  pgVar15 = sched->splits;
                  if (iVar10 <= local_bc) {
                    sched->splits_capacity = iVar10 * 2;
                    pgVar15 = (ggml_backend_sched_split *)realloc(pgVar15,(long)iVar10 * 0x170);
                    sched->splits = pgVar15;
                    if (pgVar15 == (ggml_backend_sched_split *)0x0) {
                      pcVar21 = "GGML_ASSERT(%s) failed";
                      pcVar20 = "sched->splits != NULL";
                      iVar10 = 0x480;
                      goto LAB_0012c5a2;
                    }
                  }
                  local_b8 = pgVar15 + local_bc;
                  pgVar15[local_bc].backend_id = iVar22;
                  pgVar15[local_bc].i_start = (int)uVar30;
                  pgVar15[local_bc].n_inputs = 0;
                  iVar10 = iVar22;
                  break;
                }
                if (local_b8->n_inputs == 10) {
                  sVar12 = ggml_hash_find_or_insert(hash_set,pgVar6);
                  iVar1 = sched->hv_tensor_backend_ids[sVar12];
                  _Var9 = ggml_backend_sched_buffer_supported(sched,pgVar6,iVar10);
                  if ((iVar1 != iVar10) &&
                     ((~_Var9 & sched->hv_tensor_copies
                                [sVar12 * (long)sched->n_backends * (long)sched->n_copies +
                                 (long)sched->n_copies * (long)iVar10] == (ggml_tensor *)0x0) != 0))
                  goto LAB_0012badf;
                }
              }
            }
          }
          for (lVar26 = 0; lVar26 != 10; lVar26 = lVar26 + 1) {
            pgVar6 = pgVar3->src[lVar26];
            if (pgVar6 != (ggml_tensor *)0x0) {
              sVar12 = ggml_hash_find_or_insert(hash_set,pgVar6);
              iVar22 = sched->hv_tensor_backend_ids[sVar12];
              if ((pgVar6->flags & 1) != 0) {
                uVar19 = (ulong)sched->n_copies;
                if ((1 < (long)uVar19) &&
                   (sched->hv_tensor_copies
                    [uVar19 * sVar12 * (long)sched->n_backends + (long)(iVar22 * sched->n_copies)]
                    == (ggml_tensor *)0x0)) {
                  pgVar17 = sched->backends[iVar22];
                  for (uVar29 = 0; (long)uVar29 < (long)(int)uVar19; uVar29 = uVar29 + 1) {
                    pgVar16 = pgVar6;
                    if (uVar29 != (uint)sched->cur_copy) {
                      pgVar16 = ggml_dup_tensor_layout(sched->ctx,pgVar6);
                      pcVar20 = "NULL";
                      if (pgVar17 != (ggml_backend_t)0x0) {
                        pcVar20 = (*(pgVar17->iface).get_name)(pgVar17);
                      }
                      ggml_format_name(pgVar16,"%s#%s#%d",pcVar20,pgVar6->name,uVar29 & 0xffffffff);
                      uVar19 = (ulong)(uint)sched->n_copies;
                    }
                    if (1 < (int)uVar19) {
                      ggml_set_input(pgVar16);
                      ggml_set_output(pgVar16);
                      uVar19 = (ulong)(uint)sched->n_copies;
                    }
                    sched->hv_tensor_copies
                    [sVar12 * (long)(int)uVar19 * (long)sched->n_backends +
                     (long)((int)uVar19 * iVar22) + uVar29] = pgVar16;
                  }
                  iVar1 = sched->n_graph_inputs;
                  sched->n_graph_inputs = iVar1 + 1;
                  if (9 < (long)iVar1) {
                    pcVar21 = "GGML_ASSERT(%s) failed";
                    pcVar20 = "n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                    iVar10 = 0x4a7;
                    goto LAB_0012c5a2;
                  }
                  sched->graph_inputs[iVar1] = pgVar6;
                }
              }
              if ((iVar22 != iVar10) &&
                 (_Var9 = ggml_backend_sched_buffer_supported(sched,pgVar6,iVar10), !_Var9)) {
                ppgVar18 = sched->hv_tensor_copies;
                lVar28 = (long)sched->n_backends;
                uVar19 = (ulong)sched->n_copies;
                lVar27 = uVar19 * lVar28 * sVar12;
                lVar24 = (long)(sched->n_copies * iVar10);
                if (ppgVar18[lVar27 + lVar24] == (ggml_tensor *)0x0) {
                  pgVar17 = sched->backends[iVar10];
                  uVar29 = 0;
                  while( true ) {
                    iVar22 = (int)uVar19;
                    if ((long)iVar22 <= (long)uVar29) break;
                    pgVar16 = ggml_dup_tensor_layout(sched->ctx,pgVar6);
                    pcVar20 = "NULL";
                    if (pgVar17 != (ggml_backend_t)0x0) {
                      pcVar20 = (*(pgVar17->iface).get_name)(pgVar17);
                    }
                    ggml_format_name(pgVar16,"%s#%s#%d",pcVar20,pgVar6->name,uVar29 & 0xffffffff);
                    uVar2 = sched->n_copies;
                    if (1 < (int)uVar2) {
                      ggml_set_input(pgVar16);
                      ggml_set_output(pgVar16);
                      uVar2 = sched->n_copies;
                    }
                    uVar19 = (ulong)uVar2;
                    lVar28 = (long)sched->n_backends;
                    sched->hv_tensor_copies
                    [lVar28 * sVar12 * (long)(int)uVar2 + (long)(int)(uVar2 * iVar10) + uVar29] =
                         pgVar16;
                    uVar29 = uVar29 + 1;
                  }
                  iVar1 = local_b8->n_inputs;
                  local_b8->n_inputs = iVar1 + 1;
                  if (9 < (long)iVar1) {
                    pcVar21 = "GGML_ASSERT(%s) failed";
                    pcVar20 = "n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS";
                    iVar10 = 0x4bb;
                    goto LAB_0012c5a2;
                  }
                  local_b8->inputs[iVar1] = pgVar6;
                  ppgVar18 = sched->hv_tensor_copies;
                  lVar27 = sVar12 * (long)(int)lVar28 * (long)iVar22;
                  lVar24 = (long)(iVar22 * iVar10);
                }
                pgVar3->src[lVar26] = ppgVar18[lVar27 + lVar24 + sched->cur_copy];
              }
            }
          }
        }
        uVar30 = uVar30 + 1;
      } while( true );
    }
    if (3 < graph->nodes[uVar29]->op - GGML_OP_RESHAPE) {
      piVar4 = sched->hv_tensor_backend_ids;
      sVar12 = ggml_hash_find_or_insert(hash_set,graph->nodes[uVar29]);
      iVar10 = piVar4[sVar12];
      local_b8->backend_id = iVar10;
      uVar30 = uVar29;
      goto LAB_0012b996;
    }
    uVar29 = uVar29 + 1;
  } while( true );
LAB_0012b59c:
  iVar10 = iVar22;
  if (iVar22 == sched->n_backends + -1) {
    iVar10 = -1;
  }
  goto LAB_0012b521;
}

Assistant:

static void ggml_backend_sched_split_graph(ggml_backend_sched_t sched, struct ggml_cgraph * graph) {
    // reset splits
    sched->n_splits = 0;
    sched->n_graph_inputs = 0;
    sched->is_reset = false;

    struct ggml_init_params params = {
        /* .mem_size =   */ sched->context_buffer_size,
        /* .mem_buffer = */ sched->context_buffer,
        /* .no_alloc =   */ true
    };

    ggml_free(sched->ctx);

    sched->ctx = ggml_init(params);
    if (sched->ctx == NULL) {
        GGML_ABORT("%s: failed to initialize context\n", __func__);
    }

    // pass 1: assign backends to ops with pre-allocated inputs
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        int * leaf_backend_id = &tensor_backend_id(leaf);
        // do not overwrite user assignments
        if (*leaf_backend_id == -1) {
            *leaf_backend_id = ggml_backend_sched_backend_id_from_cur(sched, leaf);
        }
    }

    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * node_backend_id = &tensor_backend_id(node);
        // do not overwrite user assignments
        if (*node_backend_id == -1) {
            *node_backend_id = ggml_backend_sched_backend_id_from_cur(sched, node);

#if 0
            // src
            if (node->op == GGML_OP_NONE) {
                continue;
            }

            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }
                int * src_backend_id = &tensor_backend_id(src);
                if (*src_backend_id == -1) {
                    *src_backend_id = ggml_backend_sched_backend_id_from_cur(sched, src);
                }
            }
#endif
        }
    }

    // pass 2: expand current backend assignments
    // assign the same backend to adjacent nodes
    // expand gpu backends (i.e. non last prio) up and down, ignoring cpu (the lowest priority backend)
    // thus, cpu will never be used unless weights are on cpu, or there are no gpu ops between cpu ops
    // ops unsupported by the backend being expanded will be left unassigned so that they can be assigned later when the locations of its inputs are known
    // expand gpu down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand gpu up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                if (*node_backend_id == sched->n_backends - 1) {
                    // skip cpu (lowest prio backend)
                    cur_backend_id = -1;
                } else {
                    cur_backend_id = *node_backend_id;
                }
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest down
    {
        int cur_backend_id = -1;
        for (int i = 0; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }
    // expand rest up
    {
        int cur_backend_id = -1;
        for (int i = graph->n_nodes - 1; i >= 0; i--) {
            struct ggml_tensor * node = graph->nodes[i];
            if (ggml_is_view_op(node->op)) {
                continue;
            }
            int * node_backend_id = &tensor_backend_id(node);
            if (*node_backend_id != -1) {
                cur_backend_id = *node_backend_id;
            } else if (cur_backend_id != -1) {
                ggml_backend_sched_set_if_supported(sched, node, cur_backend_id, node_backend_id);
            }
        }
    }

    // pass 3: upgrade nodes to higher prio backends with compatible buffer types
    // if the tensor is already in the same buffer type (*) as another higher priority backend, we should move it there
    // however, we also need to verify that the sources are in compatible buffer types
    // (*) the actual requirement is more relaxed, the buffer type of the backend should be supported by all the users of this tensor further down the graph
    // however, this is slow to verify, so we have a more strict requirement that the buffer type is the same
    // this is not uncommon since multiple backends can use host memory, with the same buffer type (eg. BLAS and CPU)
    // additionally, set remaining unassigned nodes to the backend with the most supported inputs
    // only nodes that could not be assigned during expansion due to the backend not supporting the op should be unassigned at this point
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        if (ggml_is_view_op(node->op)) {
            continue;
        }
        int * node_backend_id = &tensor_backend_id(node);
        if (*node_backend_id == -1) {
            // unassigned node: find the backend with the most supported inputs
            int n_supported_best = -1;
            for (int b = 0; b < sched->n_backends; b++) {
                if (ggml_backend_supports_op(sched->backends[b], node)) {
                    int n_supported = 0;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if ((tensor_backend_id(src) != -1 || tensor_backend_id(src->view_src) != -1) && ggml_backend_sched_buffer_supported(sched, src, b)) {
                            n_supported++;
                        }
                    }
                    if (n_supported > n_supported_best) {
                        n_supported_best = n_supported;
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.best");
                    }
                }
            }
        } else {
            // assigned node: upgrade to higher prio backend if possible
            for (int b = 0; b < *node_backend_id; b++) {
                if (sched->bufts[b] == sched->bufts[*node_backend_id] && ggml_backend_supports_op(sched->backends[b], node)) {
                    bool supported = true;
                    for (int j = 0; j < GGML_MAX_SRC; j++) {
                        struct ggml_tensor * src = node->src[j];
                        if (src == NULL) {
                            continue;
                        }
                        if (!ggml_backend_sched_buffer_supported(sched, src, b)) {
                            supported = false;
                            break;
                        }
                    }
                    if (supported) {
                        *node_backend_id = b;
                        SET_CAUSE(node, "3.upg");
                        break;
                    }
                }
            }
        }
    }

    // pass 4: assign backends to remaining src from dst and view_src
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        int * cur_backend_id = &tensor_backend_id(node);
        if (node->view_src != NULL && *cur_backend_id == -1) {
            *cur_backend_id = tensor_backend_id(node->view_src);
            SET_CAUSE(node, "4.vsrc");
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (src == NULL) {
                continue;
            }
            int * src_backend_id = &tensor_backend_id(src);
            if (*src_backend_id == -1) {
                if (src->view_src != NULL) {
                    // views are always on the same backend as the source
                    *src_backend_id = tensor_backend_id(src->view_src);
                    SET_CAUSE(src, "4.vsrc");
                } else {
                    *src_backend_id = *cur_backend_id;
                    SET_CAUSE(src, "4.cur");
                }
            }
        }
    }

    // pass 5: split graph, find tensors that need to be copied
    {
        int i_split = 0;
        struct ggml_backend_sched_split * split = &sched->splits[0];
        // find the backend of the first split, skipping view ops
        int i = 0;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];
            if (!ggml_is_view_op(node->op)) {
                split->backend_id = tensor_backend_id(node);
                break;
            }
        }
        split->i_start = 0;
        split->n_inputs = 0;
        int cur_backend_id = split->backend_id;
        for (; i < graph->n_nodes; i++) {
            struct ggml_tensor * node = graph->nodes[i];

            if (ggml_is_view_op(node->op)) {
                continue;
            }

            const int node_backend_id = tensor_backend_id(node);

            assert(node_backend_id != -1); // all nodes should be assigned by now

            // check if we should start a new split based on the sources of the current node
            bool need_new_split = false;
            if (node_backend_id == cur_backend_id && split->n_inputs > 0) {
                for (int j = 0; j < GGML_MAX_SRC; j++) {
                    struct ggml_tensor * src = node->src[j];
                    if (src == NULL) {
                        continue;
                    }
                    // check if a weight is on a different and incompatible backend
                    // by starting a new split, the memory of the previously offloaded weights can be reused
                    if (src->buffer != NULL && src->buffer->usage == GGML_BACKEND_BUFFER_USAGE_WEIGHTS) {
                        int src_backend_id = tensor_backend_id(src);
                        if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                            need_new_split = true;
                            break;
                        }
                    }
                    // check if the split has too many inputs
                    // FIXME: count the number of inputs instead of only checking when full
                    if (split->n_inputs == GGML_SCHED_MAX_SPLIT_INPUTS) {
                        const size_t id = hash_id(src);
                        int src_backend_id = sched->hv_tensor_backend_ids[id];
                        bool supported = ggml_backend_sched_buffer_supported(sched, src, cur_backend_id);
                        if (src_backend_id != cur_backend_id && tensor_id_copy(id, cur_backend_id, 0) == NULL && !supported) {
                            need_new_split = true;
                            break;
                        }
                    }
                }
            }

            if (node_backend_id != cur_backend_id || need_new_split) {
                split->i_end = i;
                i_split++;
                if (i_split >= sched->splits_capacity) {
                    sched->splits_capacity *= 2;
                    sched->splits = (ggml_backend_sched_split *)
                        realloc(sched->splits, sched->splits_capacity * sizeof(struct ggml_backend_sched_split));
                    GGML_ASSERT(sched->splits != NULL);
                }
                split = &sched->splits[i_split];
                split->backend_id = node_backend_id;
                split->i_start = i;
                split->n_inputs = 0;
                cur_backend_id = node_backend_id;
            }

            // find inputs that are not on the same backend
            for (int j = 0; j < GGML_MAX_SRC; j++) {
                struct ggml_tensor * src = node->src[j];
                if (src == NULL) {
                    continue;
                }

                size_t src_id = hash_id(src);
                const int src_backend_id = sched->hv_tensor_backend_ids[src_id];
                assert(src_backend_id != -1); // all inputs should be assigned by now

                if (src->flags & GGML_TENSOR_FLAG_INPUT && sched->n_copies > 1) {
                    if (tensor_id_copy(src_id, src_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[src_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy;
                            if (c == sched->cur_copy) {
                                tensor_copy = src; // use the original tensor as the current copy
                            } else {
                                tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                                ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            }
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, src_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_graph_inputs = sched->n_graph_inputs++;
                        GGML_ASSERT(n_graph_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        sched->graph_inputs[n_graph_inputs] = src;
                    }
                }

                if (src_backend_id != cur_backend_id && !ggml_backend_sched_buffer_supported(sched, src, cur_backend_id)) {
                    // create a copy of the input in the split's backend
                    if (tensor_id_copy(src_id, cur_backend_id, 0) == NULL) {
                        ggml_backend_t backend = sched->backends[cur_backend_id];
                        for (int c = 0; c < sched->n_copies; c++) {
                            struct ggml_tensor * tensor_copy = ggml_dup_tensor_layout(sched->ctx, src);
                            ggml_format_name(tensor_copy, "%s#%s#%d", ggml_backend_name(backend), src->name, c);
                            if (sched->n_copies > 1) {
                                ggml_set_input(tensor_copy);
                                ggml_set_output(tensor_copy); // prevent ggml-alloc from overwriting the tensor
                            }
                            tensor_id_copy(src_id, cur_backend_id, c) = tensor_copy;
                            SET_CAUSE(tensor_copy, "4.cpy");
                        }
                        int n_inputs = split->n_inputs++;
                        GGML_ASSERT(n_inputs < GGML_SCHED_MAX_SPLIT_INPUTS);
                        split->inputs[n_inputs] = src;
                    }
                    node->src[j] = tensor_id_copy(src_id, cur_backend_id, sched->cur_copy);
                }
            }
        }
        split->i_end = graph->n_nodes;
        sched->n_splits = i_split + 1;
    }

    if (sched->debug) {
        ggml_backend_sched_print_assignments(sched, graph);
    }

    // swap node_backend_ids and leaf _backend_ids with prevs
    {
        int * tmp = sched->node_backend_ids;
        sched->node_backend_ids = sched->prev_node_backend_ids;
        sched->prev_node_backend_ids = tmp;

        tmp = sched->leaf_backend_ids;
        sched->leaf_backend_ids = sched->prev_leaf_backend_ids;
        sched->prev_leaf_backend_ids = tmp;
    }

    int graph_size = std::max(graph->n_nodes, graph->n_leafs) + sched->n_splits*GGML_SCHED_MAX_SPLIT_INPUTS*2*sched->n_copies;
    if (sched->graph.size < graph_size) {
        sched->graph.size = graph_size;
        sched->graph.nodes = (ggml_tensor **) realloc(sched->graph.nodes, graph_size * sizeof(struct ggml_tensor *));
        sched->graph.leafs = (ggml_tensor **) realloc(sched->graph.leafs, graph_size * sizeof(struct ggml_tensor *));
        GGML_ASSERT(sched->graph.nodes != NULL);
        GGML_ASSERT(sched->graph.leafs != NULL);
    }
    sched->graph.n_nodes = 0;
    sched->graph.n_leafs = 0;

    struct ggml_cgraph * graph_copy = &sched->graph;

    for (int i = 0; i < sched->n_splits; i++) {
        struct ggml_backend_sched_split * split = &sched->splits[i];
        split->graph = ggml_graph_view(graph, split->i_start, split->i_end);

        // add inputs to the graph copy so that they are allocated by ggml-alloc at the start of the split
        for (int j = 0; j < split->n_inputs; j++) {
            assert(graph_copy->size > (graph_copy->n_nodes + 1));

            struct ggml_tensor * input = split->inputs[j];
            const size_t input_id = hash_id(input);
            struct ggml_tensor * input_cpy = tensor_id_copy(input_id, split->backend_id, sched->cur_copy);

            // add a dependency to the input source so that it is not freed before the copy is done
            struct ggml_tensor * input_dep = ggml_view_tensor(sched->ctx, input);
            input_dep->src[0] = input;
            sched->node_backend_ids[graph_copy->n_nodes] = sched->hv_tensor_backend_ids[input_id];
            graph_copy->nodes[graph_copy->n_nodes++] = input_dep;

            // add a dependency to the input copy so that it is allocated at the start of the split
            sched->node_backend_ids[graph_copy->n_nodes] = split->backend_id;
            graph_copy->nodes[graph_copy->n_nodes++] = input_cpy;
        }

        for (int j = split->i_start; j < split->i_end; j++) {
            assert(graph_copy->size > graph_copy->n_nodes);
            sched->node_backend_ids[graph_copy->n_nodes] = tensor_backend_id(graph->nodes[j]);
            graph_copy->nodes[graph_copy->n_nodes++] = graph->nodes[j];
        }
    }

    if (sched->n_copies > 1) {
        // add input copies as leafs so that they are allocated first
        for (int i = 0; i < sched->n_graph_inputs; i++) {
            struct ggml_tensor * input = sched->graph_inputs[i];
            size_t id = hash_id(input);
            int backend_id = tensor_backend_id(input);
            for (int c = 0; c < sched->n_copies; c++) {
                struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                assert(graph_copy->size > graph_copy->n_leafs);
                graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
            }
        }

        for (int i = 0; i < sched->n_splits; i++) {
            struct ggml_backend_sched_split * split = &sched->splits[i];
            int backend_id = split->backend_id;
            for (int j = 0; j < split->n_inputs; j++) {
                struct ggml_tensor * input = split->inputs[j];
                size_t id = hash_id(input);
                for (int c = 0; c < sched->n_copies; c++) {
                    struct ggml_tensor * input_cpy = tensor_id_copy(id, backend_id, c);
                    sched->leaf_backend_ids[graph_copy->n_leafs] = backend_id;
                    assert(graph_copy->size > graph_copy->n_leafs);
                    graph_copy->leafs[graph_copy->n_leafs++] = input_cpy;
                }
            }
        }
    }

    // add leafs from the original graph
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        sched->leaf_backend_ids[graph_copy->n_leafs] = tensor_backend_id(leaf);
        assert(graph_copy->size > graph_copy->n_leafs);
        graph_copy->leafs[graph_copy->n_leafs++] = leaf;
    }
}